

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

Point2f __thiscall pbrt::SobolSampler::GetPixel2D(SobolSampler *this)

{
  undefined8 uVar1;
  Tuple2<pbrt::Point2,_float> TVar2;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  bool bVar5;
  Float FVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_register_000012c4 [12];
  Point2f u;
  
  FVar6 = SampleDimension(this,0);
  u.super_Tuple2<pbrt::Point2,_float>.y = SampleDimension(this,1);
  u.super_Tuple2<pbrt::Point2,_float>.x = FVar6;
  iVar4 = 2;
  while (iVar4 != 0) {
    if (GetPixel2D()::reg == '\0') {
      iVar3 = __cxa_guard_acquire(&GetPixel2D()::reg);
      if (iVar3 != 0) {
        StatRegisterer::StatRegisterer
                  ((StatRegisterer *)&GetPixel2D()::reg,
                   GetPixel2D()::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,
                   (PixelAccumFunc)0x0);
        __cxa_guard_release(&GetPixel2D()::reg);
      }
    }
    *(long *)(in_FS_OFFSET + -0x600) = *(long *)(in_FS_OFFSET + -0x600) + 1;
    bVar5 = iVar4 != 2;
    auVar7._0_4_ = (float)this->scale;
    auVar7._4_12_ = in_register_000012c4;
    auVar9._0_4_ = (float)(&(this->pixel).super_Tuple2<pbrt::Point2,_int>.x)[bVar5];
    auVar9._4_12_ = in_register_000012c4;
    auVar7 = vfmsub231ss_fma(auVar9,auVar7,
                             ZEXT416((uint)(&u.super_Tuple2<pbrt::Point2,_float>.x)[bVar5]));
    if (auVar7._0_4_ < 0.0) {
      *(long *)(in_FS_OFFSET + -0x608) = *(long *)(in_FS_OFFSET + -0x608) + 1;
    }
    if (GetPixel2D()::reg == '\0') {
      iVar3 = __cxa_guard_acquire(&GetPixel2D()::reg);
      if (iVar3 != 0) {
        StatRegisterer::StatRegisterer
                  ((StatRegisterer *)&GetPixel2D()::reg,
                   GetPixel2D()::{lambda(pbrt::StatsAccumulator&)#2}::StatsAccumulator__,
                   (PixelAccumFunc)0x0);
        __cxa_guard_release(&GetPixel2D()::reg);
      }
    }
    *(long *)(in_FS_OFFSET + -0x5f0) = *(long *)(in_FS_OFFSET + -0x5f0) + 1;
    auVar10._0_4_ = (float)this->scale;
    auVar10._4_12_ = in_register_000012c4;
    auVar8._0_4_ = (float)(&(this->pixel).super_Tuple2<pbrt::Point2,_int>.x)[bVar5];
    auVar8._4_12_ = in_register_000012c4;
    auVar7 = vfmsub231ss_fma(auVar8,auVar10,
                             ZEXT416((uint)(&u.super_Tuple2<pbrt::Point2,_float>.x)[bVar5]));
    if (1.0 < auVar7._0_4_) {
      *(long *)(in_FS_OFFSET + -0x5f8) = *(long *)(in_FS_OFFSET + -0x5f8) + 1;
    }
    uVar1 = vcmpss_avx512f(auVar7,ZEXT816(0) << 0x40,1);
    auVar7 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar7);
    (&u.super_Tuple2<pbrt::Point2,_float>.x)[bVar5] =
         (float)((uint)!(bool)((byte)uVar1 & 1) * auVar7._0_4_);
    iVar4 = iVar4 + -1;
  }
  TVar2.y = u.super_Tuple2<pbrt::Point2,_float>.y;
  TVar2.x = u.super_Tuple2<pbrt::Point2,_float>.x;
  return (Point2f)TVar2;
}

Assistant:

PBRT_CPU_GPU
    Point2f GetPixel2D() {
        Point2f u(SampleDimension(0), SampleDimension(1));
        // Remap Sobol$'$ dimensions used for pixel samples
        for (int dim = 0; dim < 2; ++dim) {
            CHECK_RARE(1e-7, u[dim] * scale - pixel[dim] < 0);
            CHECK_RARE(1e-7, u[dim] * scale - pixel[dim] > 1);
            u[dim] = Clamp(u[dim] * scale - pixel[dim], 0, OneMinusEpsilon);
        }

        return u;
    }